

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::RandomBernoulliStaticLayerParams::MergePartialFromCodedStream
          (RandomBernoulliStaticLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  float *pfVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  undefined8 in_RAX;
  unsigned_long uVar8;
  char cVar9;
  ulong uVar10;
  float fVar11;
  pair<unsigned_long,_bool> pVar12;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
LAB_003b9ea2:
  pbVar2 = input->buffer_;
  uVar6 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar6 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_003b9ec5;
    input->buffer_ = pbVar2 + 1;
    uVar10 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_003b9ec5:
    uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
    uVar10 = 0;
    if (uVar6 - 1 < 0x7f) {
      uVar10 = 0x100000000;
    }
    uVar10 = uVar6 | uVar10;
  }
  uVar6 = (uint32)uVar10;
  if ((uVar10 & 0x100000000) != 0) {
    uVar7 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar10;
    if (uVar7 == 3) {
      if (cVar9 == '\x18') {
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (1,0x1a,input,&this->outputshape_);
      }
      else {
        if ((uVar6 & 0xff) != 0x1a) goto LAB_003b9ee6;
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->outputshape_);
      }
      goto LAB_003b9f06;
    }
    if (uVar7 == 2) {
      if (cVar9 != '\x15') goto LAB_003b9ee6;
      pfVar4 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
        bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)((long)&uStack_38 + 4));
        if (!bVar5) {
          return false;
        }
        fVar11 = uStack_38._4_4_;
      }
      else {
        fVar11 = *pfVar4;
        input->buffer_ = (uint8 *)(pfVar4 + 1);
      }
      this->prob_ = fVar11;
      goto LAB_003b9ea2;
    }
    if ((uVar7 == 1) && (cVar9 == '\b')) {
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (uVar8 = (unsigned_long)(char)*puVar3, -1 < (long)uVar8))
      {
        input->buffer_ = puVar3 + 1;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar8 = pVar12.first;
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->seed_ = uVar8;
      goto LAB_003b9ea2;
    }
  }
LAB_003b9ee6:
  if (uVar6 == 0) {
    return true;
  }
  if ((uVar6 & 7) == 4) {
    return true;
  }
  bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
LAB_003b9f06:
  if (bVar5 == false) {
    return false;
  }
  goto LAB_003b9ea2;
}

Assistant:

bool RandomBernoulliStaticLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.RandomBernoulliStaticLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 seed = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &seed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float prob = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &prob_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 outputShape = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_outputshape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(24u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 1, 26u, input, this->mutable_outputshape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.RandomBernoulliStaticLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.RandomBernoulliStaticLayerParams)
  return false;
#undef DO_
}